

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O0

void __thiscall
helics::CloningFilter::CloningFilter
          (CloningFilter *this,InterfaceVisibility locality,Federate *ffed,string_view filtName)

{
  string_view filtName_00;
  string_view outputType;
  string_view inputType;
  string_view outputType_00;
  shared_ptr<helics::FilterOperations> *in_RDX;
  int in_ESI;
  Federate *in_RDI;
  Federate *in_stack_fffffffffffffef0;
  Filter *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  InterfaceHandle ihandle;
  size_t in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  string_view in_stack_ffffffffffffff28;
  string_view in_stack_ffffffffffffff38;
  CloningFilter *local_b8;
  CloningFilter *in_stack_ffffffffffffff50;
  CloningFilter *pCVar1;
  char *in_stack_ffffffffffffff58;
  Federate *in_stack_ffffffffffffff80;
  CloningFilter *in_stack_ffffffffffffff88;
  CloningFilter *in_stack_ffffffffffffff90;
  string_view in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  InterfaceHandle local_3c [5];
  shared_ptr<helics::FilterOperations> *local_28;
  int local_1c;
  
  ihandle.hid = (BaseType)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  local_28 = in_RDX;
  local_1c = in_ESI;
  memset(local_3c,0,4);
  InterfaceHandle::InterfaceHandle(local_3c);
  filtName_00._M_str = in_stack_ffffffffffffff10;
  filtName_00._M_len = in_stack_ffffffffffffff08;
  Filter::Filter(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,filtName_00,ihandle);
  in_RDI->_vptr_Federate = (_func_int **)&PTR__CloningFilter_0091e128;
  if (local_28 != (shared_ptr<helics::FilterOperations> *)0x0) {
    if (local_1c == 1) {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff98);
      pCVar1 = in_stack_ffffffffffffff50;
      in_stack_ffffffffffffff50 = in_stack_ffffffffffffff90;
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff88);
      outputType._M_str = in_stack_ffffffffffffff58;
      outputType._M_len = (size_t)pCVar1;
      Federate::registerGlobalCloningFilter
                (in_RDI,in_stack_ffffffffffffff38,in_stack_ffffffffffffff28,outputType);
      operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff88);
    }
    else {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff58);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&local_b8);
      inputType._M_str = (char *)in_stack_ffffffffffffff90;
      inputType._M_len = (size_t)in_stack_ffffffffffffff88;
      outputType_00._M_str = in_stack_ffffffffffffffb8;
      outputType_00._M_len = in_stack_ffffffffffffffb0;
      Federate::registerCloningFilter
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff98,inputType,outputType_00);
      operator=(in_stack_ffffffffffffff50,local_b8);
      in_stack_ffffffffffffff88 = local_b8;
    }
    std::make_shared<helics::CloneFilterOperation>();
    std::shared_ptr<helics::FilterOperations>::shared_ptr<helics::CloneFilterOperation,void>
              ((shared_ptr<helics::FilterOperations> *)in_stack_ffffffffffffff50,
               (shared_ptr<helics::CloneFilterOperation> *)in_stack_ffffffffffffff88);
    Filter::setFilterOperations((Filter *)in_RDI,in_RDX);
    std::shared_ptr<helics::FilterOperations>::~shared_ptr
              ((shared_ptr<helics::FilterOperations> *)0x2cad23);
    std::shared_ptr<helics::CloneFilterOperation>::~shared_ptr
              ((shared_ptr<helics::CloneFilterOperation> *)0x2cad2d);
  }
  return;
}

Assistant:

CloningFilter::CloningFilter(InterfaceVisibility locality,
                             Federate* ffed,
                             std::string_view filtName): Filter(ffed, filtName, InterfaceHandle())
{
    if (ffed != nullptr) {
        if (locality == InterfaceVisibility::GLOBAL) {
            operator=(ffed->registerGlobalCloningFilter(filtName));
        } else {
            operator=(ffed->registerCloningFilter(filtName));
        }

        setFilterOperations(std::make_shared<CloneFilterOperation>());
    }
}